

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyDiscretePure.cpp
# Opt level: O0

PartialJointPolicyDiscretePure * __thiscall
PartialJointPolicyDiscretePure::operator=
          (PartialJointPolicyDiscretePure *this,PartialJointPolicyDiscretePure *o)

{
  PartialJointPolicyDiscretePure *in_RSI;
  PartialJointPolicyDiscretePure *in_RDI;
  PartialJointPolicyDiscretePure *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    JointPolicyDiscretePure::operator=
              (&in_RSI->super_JointPolicyDiscretePure,&in_RDI->super_JointPolicyDiscretePure);
    PartialJointPolicy::operator=
              (&in_RDI->super_PartialJointPolicy,&in_RSI->super_PartialJointPolicy);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

PartialJointPolicyDiscretePure& PartialJointPolicyDiscretePure::operator= (const PartialJointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "PartialJointPolicyDiscretePure& PartialJointPolicyDiscretePure::operator= (const PartialJointPolicyDiscretePure& o) called"<<endl;
#endif

    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    JointPolicyDiscretePure::operator= ( o );
    PartialJointPolicy::operator= ( o );

    return *this;
}